

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_impl.h
# Opt level: O0

crc32_func_t arch_select_crc32_func(void)

{
  u32 uVar1;
  u32 features;
  crc32_func_t local_8;
  
  uVar1 = get_x86_cpu_features();
  if (((((uVar1 & 0x20) == 0) || ((uVar1 & 0x100) == 0)) || ((uVar1 & 2) == 0)) ||
     (((uVar1 & 0x40) == 0 || ((uVar1 & 0x80) == 0)))) {
    if ((((uVar1 & 0x100) == 0) || (((uVar1 & 2) == 0 || ((uVar1 & 0x40) == 0)))) ||
       ((uVar1 & 0x80) == 0)) {
      if ((((uVar1 & 0x100) == 0) || ((uVar1 & 2) == 0)) || ((uVar1 & 8) == 0)) {
        if (((uVar1 & 2) == 0) || ((uVar1 & 4) == 0)) {
          if ((uVar1 & 2) == 0) {
            local_8 = (crc32_func_t)0x0;
          }
          else {
            local_8 = crc32_x86_pclmulqdq;
          }
        }
        else {
          local_8 = crc32_x86_pclmulqdq_avx;
        }
      }
      else {
        local_8 = crc32_x86_vpclmulqdq_avx2;
      }
    }
    else {
      local_8 = crc32_x86_vpclmulqdq_avx512_vl256;
    }
  }
  else {
    local_8 = crc32_x86_vpclmulqdq_avx512_vl512;
  }
  return local_8;
}

Assistant:

static inline crc32_func_t
arch_select_crc32_func(void)
{
	const u32 features MAYBE_UNUSED = get_x86_cpu_features();

#ifdef crc32_x86_vpclmulqdq_avx512_vl512
	if ((features & X86_CPU_FEATURE_ZMM) &&
	    HAVE_VPCLMULQDQ(features) && HAVE_PCLMULQDQ(features) &&
	    HAVE_AVX512BW(features) && HAVE_AVX512VL(features))
		return crc32_x86_vpclmulqdq_avx512_vl512;
#endif
#ifdef crc32_x86_vpclmulqdq_avx512_vl256
	if (HAVE_VPCLMULQDQ(features) && HAVE_PCLMULQDQ(features) &&
	    HAVE_AVX512BW(features) && HAVE_AVX512VL(features))
		return crc32_x86_vpclmulqdq_avx512_vl256;
#endif
#ifdef crc32_x86_vpclmulqdq_avx2
	if (HAVE_VPCLMULQDQ(features) && HAVE_PCLMULQDQ(features) &&
	    HAVE_AVX2(features))
		return crc32_x86_vpclmulqdq_avx2;
#endif
#ifdef crc32_x86_pclmulqdq_avx
	if (HAVE_PCLMULQDQ(features) && HAVE_AVX(features))
		return crc32_x86_pclmulqdq_avx;
#endif
#ifdef crc32_x86_pclmulqdq
	if (HAVE_PCLMULQDQ(features))
		return crc32_x86_pclmulqdq;
#endif
	return NULL;
}